

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O0

bool __thiscall
baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::item::operator<
          (item *this,item *other)

{
  item *other_local;
  item *this_local;
  
  return other->r / (float)this->factor < this->r / (float)this->factor;
}

Assistant:

constexpr bool operator<(const item& other) const noexcept
        {
            if constexpr (std::is_same_v<Mode, minimize_tag>)
                return (r / static_cast<Float>(factor)) <
                       (other.r / static_cast<Float>(factor));
            else
                return (other.r / static_cast<Float>(factor)) <
                       (r / static_cast<Float>(factor));
        }